

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O1

void __thiscall GoniometricLight_Sampling_Test::TestBody(GoniometricLight_Sampling_Test *this)

{
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 uVar1;
  bool bVar2;
  RGBColorSpace *imageColorSpace;
  int iVar3;
  Allocator AVar4;
  int i;
  long lVar5;
  float fVar6;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  SampledWavelengths lambda;
  Image image;
  GoniometricLight light;
  undefined1 local_538 [8];
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TStack_530;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  aStack_528;
  size_t local_518;
  size_t local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  LightHandle local_4e0;
  SpectrumHandle local_4d8;
  Image local_4d0;
  undefined1 local_3b8 [160];
  polymorphic_allocator<float> local_318;
  float *local_310;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_308;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_300;
  undefined1 local_2e0 [168];
  polymorphic_allocator<unsigned_char> local_238;
  uchar *local_230;
  size_t local_228;
  size_t local_220;
  polymorphic_allocator<pbrt::Half> local_218;
  Half *local_210;
  size_t local_208;
  size_t local_200;
  polymorphic_allocator<float> local_1f8;
  float *local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  local_1b8;
  polymorphic_allocator<float> local_198;
  float *local_190;
  size_t local_188;
  size_t local_180;
  polymorphic_allocator<float> local_178;
  float *local_170;
  size_t local_168;
  size_t local_160;
  Image local_148;
  
  MakeLightImage(&local_4d0,(Point2i)0x10000000200);
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"R","");
  requestedChannels.n = 1;
  requestedChannels.ptr = &local_500;
  pbrt::Image::GetChannelDesc((ImageChannelDesc *)local_538,&local_4d0,requestedChannels);
  AVar4.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Image::SelectChannels((Image *)local_3b8,&local_4d0,(ImageChannelDesc *)local_538,AVar4);
  this_00 = &local_4d0.channelNames;
  local_4d0.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_3b8._8_4_;
  local_4d0.format = local_3b8._0_4_;
  local_4d0.resolution.super_Tuple2<pbrt::Point2,_int>.x = local_3b8._4_4_;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_3b8 + 0x10));
  local_4d0.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            )local_308.bits;
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            (&local_4d0.p8,&local_300);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
            (&local_4d0.p16,
             (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_2e0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&local_4d0.p32,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_2e0 + 0x20));
  local_2e0._56_8_ = 0;
  (*(*(_func_int ***)local_2e0._32_8_)[3])
            (local_2e0._32_8_,local_2e0._40_8_,local_2e0._48_8_ << 2,4);
  local_2e0._24_8_ = 0;
  (*(*(_func_int ***)local_2e0._0_8_)[3])(local_2e0._0_8_,local_2e0._8_8_,local_2e0._16_8_ * 2,2);
  local_300.nStored = 0;
  (*(local_300.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_300.alloc.memoryResource,local_300.ptr,local_300.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_3b8 + 0x10));
  local_510 = 0;
  (*(*(_func_int ***)local_538)[3])(local_538,TStack_530.bits,local_518 << 2,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (TestBody()::I == '\0') {
    TestBody();
  }
  if (TestBody()::id == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::id);
    if (iVar3 != 0) {
      pbrt::Transform::Transform(&TestBody::id);
      __cxa_guard_release(&TestBody()::id);
    }
  }
  local_538 = (undefined1  [8])0x0;
  TStack_530.bits = 0;
  local_4d8.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )0x10000031a2938;
  local_148.format = local_4d0.format;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       local_4d0.resolution.super_Tuple2<pbrt::Point2,_int>.x;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       local_4d0.resolution.super_Tuple2<pbrt::Point2,_int>.y;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&local_148.channelNames,this_00);
  imageColorSpace = pbrt::RGBColorSpace::sRGB;
  local_148.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = local_4d0.encoding.
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  local_148.p8.alloc.memoryResource = local_4d0.p8.alloc.memoryResource;
  local_148.p8.nAlloc = local_4d0.p8.nAlloc;
  local_148.p8.nStored = local_4d0.p8.nStored;
  local_148.p8.ptr = local_4d0.p8.ptr;
  local_4d0.p8.ptr = (uchar *)0x0;
  local_4d0.p8.nAlloc = 0;
  local_4d0.p8.nStored = 0;
  local_148.p16.alloc.memoryResource = local_4d0.p16.alloc.memoryResource;
  local_148.p16.nAlloc = local_4d0.p16.nAlloc;
  local_148.p16.nStored = local_4d0.p16.nStored;
  local_148.p16.ptr = local_4d0.p16.ptr;
  local_4d0.p16.nStored = 0;
  local_4d0.p16.ptr = (Half *)0x0;
  local_4d0.p16.nAlloc = 0;
  local_148.p32.alloc.memoryResource = local_4d0.p32.alloc.memoryResource;
  local_148.p32.nAlloc = local_4d0.p32.nAlloc;
  local_148.p32.nStored = local_4d0.p32.nStored;
  local_148.p32.ptr = local_4d0.p32.ptr;
  local_4d0.p32.nStored = 0;
  local_4d0.p32.ptr = (float *)0x0;
  local_4d0.p32.nAlloc = 0;
  AVar4.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::GoniometricLight::GoniometricLight
            ((GoniometricLight *)local_3b8,&TestBody::id,(MediumInterface *)local_538,&local_4d8,1.0
             ,&local_148,imageColorSpace,AVar4);
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  lVar5 = 1;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  TStack_530.bits = 0;
  local_538 = (undefined1  [8])0x4414c000;
  fVar6 = 595.0;
  do {
    fVar6 = fVar6 + 117.5;
    uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar6),SUB6416(ZEXT464(0x444f8000),0),0xe);
    bVar2 = (bool)((byte)uVar1 & 1);
    fVar6 = (float)((uint)bVar2 * (int)(fVar6 + -830.0 + 360.0) + (uint)!bVar2 * (int)fVar6);
    *(float *)(local_538 + lVar5 * 4) = fVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  aStack_528._0_8_ = 0x3b0b70343b0b7034;
  aStack_528._8_8_ = 0x3b0b70343b0b7034;
  local_4e0.
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           )((ulong)local_3b8 | 0x4000000000000);
  testPhiVsSampled(&local_4e0,(SampledWavelengths *)local_538);
  local_160 = 0;
  (*(local_178.memoryResource)->_vptr_memory_resource[3])
            (local_178.memoryResource,local_170,local_168 << 2,4);
  local_180 = 0;
  (*(local_198.memoryResource)->_vptr_memory_resource[3])
            (local_198.memoryResource,local_190,local_188 << 2,4);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  ~vector(&local_1b8);
  local_1e0 = 0;
  (*(local_1f8.memoryResource)->_vptr_memory_resource[3])
            (local_1f8.memoryResource,local_1f0,local_1e8 << 2,4);
  local_200 = 0;
  (*(local_218.memoryResource)->_vptr_memory_resource[3])
            (local_218.memoryResource,local_210,local_208 * 2,2);
  local_220 = 0;
  (*(local_238.memoryResource)->_vptr_memory_resource[3])
            (local_238.memoryResource,local_230,local_228,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e0);
  local_300.alloc.memoryResource = (memory_resource *)0x0;
  (*(local_318.memoryResource)->_vptr_memory_resource[3])
            (local_318.memoryResource,local_310,local_308.bits << 2,4);
  local_4d0.p32.nStored = 0;
  (*(local_4d0.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_4d0.p32.alloc.memoryResource,local_4d0.p32.ptr,local_4d0.p32.nAlloc << 2,4);
  local_4d0.p16.nStored = 0;
  (*(local_4d0.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_4d0.p16.alloc.memoryResource,local_4d0.p16.ptr,local_4d0.p16.nAlloc * 2,2);
  local_4d0.p8.nStored = 0;
  (*(local_4d0.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_4d0.p8.alloc.memoryResource,local_4d0.p8.ptr,local_4d0.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(this_00);
  return;
}

Assistant:

TEST(GoniometricLight, Sampling) {
    Image image = MakeLightImage({512, 256});
    image = image.SelectChannels(image.GetChannelDesc({"R"}));

    static ConstantSpectrum I(10.);
    static Transform id;
    GoniometricLight light(id, MediumInterface(), &I, 1.f, std::move(image),
                           RGBColorSpace::sRGB, Allocator());
    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    testPhiVsSampled(LightHandle(&light), lambda);
}